

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

uint32_t __thiscall kratos::Expr::width(Expr *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_78;
  Var *local_70;
  string local_68;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  allocator_type local_29;
  
  bVar1 = is_relational_op(this->op);
  uVar2 = 1;
  if (!bVar1) {
    bVar1 = is_reduction_op(this->op);
    if (!bVar1) {
      uVar2 = (*(this->left->super_IRNode)._vptr_IRNode[7])();
      if (this->right != (Var *)0x0) {
        uVar3 = (*(this->right->super_IRNode)._vptr_IRNode[7])();
        if (uVar2 != uVar3) {
          this_00 = (VarException *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Unable to resolve expression width","");
          local_78 = this->left;
          local_70 = this->right;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_78;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_48,__l,&local_29);
          VarException::VarException(this_00,&local_68,&local_48);
          __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

uint32_t Expr::width() const {
    if (is_relational_op(op) || is_reduction_op(op)) return 1;
    auto left_width = left->width();
    if (right) {
        auto right_width = right->width();
        // LCOV_EXCL_START
        if (left_width != right_width)
            throw VarException("Unable to resolve expression width", {left, right});
        // LCOV_EXCL_STOP
        return left_width;
    }
    return left_width;
}